

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_range.h
# Opt level: O3

ValueIterator * __thiscall
llvm::iterator_range<llvm::DWARFDebugNames::ValueIterator>::end
          (ValueIterator *__return_storage_ptr__,
          iterator_range<llvm::DWARFDebugNames::ValueIterator> *this)

{
  pointer pcVar1;
  
  __return_storage_ptr__->IsLocal = (this->end_iterator).IsLocal;
  __return_storage_ptr__->CurrentIndex = (this->end_iterator).CurrentIndex;
  optional_detail::OptionalStorage<llvm::DWARFDebugNames::Entry,_false>::OptionalStorage
            (&(__return_storage_ptr__->CurrentEntry).Storage,
             &(this->end_iterator).CurrentEntry.Storage);
  __return_storage_ptr__->DataOffset = (this->end_iterator).DataOffset;
  (__return_storage_ptr__->Key)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Key).field_2;
  pcVar1 = (this->end_iterator).Key._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->Key,pcVar1,
             pcVar1 + (this->end_iterator).Key._M_string_length);
  (__return_storage_ptr__->Hash).Storage = (this->end_iterator).Hash.Storage;
  return __return_storage_ptr__;
}

Assistant:

IteratorT end() const { return end_iterator; }